

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordset.cpp
# Opt level: O1

void set_priority(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *v,string *word)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *ppVar3
  ;
  char *pcVar4;
  char *pcVar5;
  pointer ppVar6;
  pointer pcVar7;
  uint uVar8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *ppVar9
  ;
  size_t sVar10;
  pointer ppVar11;
  pointer ppVar12;
  bool bVar13;
  int iVar14;
  long lVar15;
  pointer pbVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  uint uVar17;
  _ValueType __value;
  string str;
  priority_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_iamareebjamal[P]spell_correct_cpp_wordset_cpp:134:20)>
  result;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  compound;
  undefined1 local_178 [24];
  undefined8 uStack_160;
  int local_158;
  undefined1 *local_150;
  size_t local_148;
  undefined1 local_140 [16];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_130;
  undefined1 local_110 [32];
  int local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  pointer local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  string local_b8;
  value_type local_98;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_178._16_8_ = (pointer)0x0;
  local_130.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
       )0x0;
  local_130.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
       )0x0;
  local_130.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)local_178);
  pbVar16 = (v->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_e0 = (v->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = v;
  if (pbVar16 != local_e0) {
    do {
      local_150 = local_140;
      pcVar7 = (pbVar16->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,pcVar7,pcVar7 + pbVar16->_M_string_length);
      sVar10 = local_148;
      uVar17 = 0;
      if (local_148 == word->_M_string_length) {
        if (local_148 == 0) {
          uVar17 = 10;
        }
        else {
          iVar14 = bcmp(local_150,(word->_M_dataplus)._M_p,local_148);
          uVar17 = 0;
          if (iVar14 == 0) {
            uVar17 = 10;
          }
        }
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_150,local_150 + sVar10);
      pcVar7 = (word->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar7,pcVar7 + word->_M_string_length);
      bVar13 = is_weak_anagram(&local_b8,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      uVar8 = uVar17 | 5;
      if (!bVar13) {
        uVar8 = uVar17;
      }
      bVar13 = local_148 == word->_M_string_length;
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char*>((string *)local_d8,local_150,local_150 + local_148);
      local_70[0] = local_60;
      pcVar7 = (word->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar7,pcVar7 + word->_M_string_length);
      iVar14 = bVar13 + uVar8 + -2;
      lVar15 = 0;
      do {
        pcVar4 = local_d8[0] + lVar15;
        iVar14 = iVar14 + 2;
        pcVar5 = local_70[0] + lVar15;
        lVar15 = lVar15 + 1;
      } while (*pcVar4 == *pcVar5);
      paVar2 = &local_98.first.field_2;
      ppVar6 = (pointer)(local_178 + 0x10);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0]);
      }
      local_98.first._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_150,local_150 + local_148)
      ;
      local_98.second = iVar14;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::push_back(&local_130,&local_98);
      local_178._0_8_ =
           local_130.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].first._M_dataplus._M_p;
      paVar1 = &local_130.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._0_8_ == paVar1) {
        local_178._16_8_ = paVar1->_M_allocated_capacity;
        uStack_160 = *(undefined8 *)
                      ((long)&local_130.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].first.field_2 + 8);
        local_178._0_8_ = ppVar6;
      }
      else {
        local_178._16_8_ = paVar1->_M_allocated_capacity;
      }
      local_110._8_8_ =
           local_130.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].first._M_string_length;
      local_130.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].first._M_dataplus._M_p = (pointer)paVar1;
      local_130.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].first._M_string_length = 0;
      local_130.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].first.field_2._M_local_buf[0] = '\0';
      local_158 = local_130.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].second;
      if ((pointer)local_178._0_8_ == ppVar6) {
        local_110._24_8_ = uStack_160;
        local_110._0_8_ = (pointer)(local_110 + 0x10);
      }
      else {
        local_110._0_8_ = local_178._0_8_;
      }
      local_110._16_8_ = local_178._16_8_;
      local_178._8_8_ = (pointer)0x0;
      local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
      local_178._0_8_ = ppVar6;
      local_f0 = local_158;
      std::
      __push_heap<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,int>*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>,long,std::pair<std::__cxx11::string,int>,__gnu_cxx::__ops::_Iter_comp_val<set_priority(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&)::__0>>
                ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                  )local_130.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 ((long)local_130.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_130.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 + -1,0
                 ,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                   *)local_110,
                 (_Iter_comp_val<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_iamareebjamal[P]spell_correct_cpp_wordset_cpp:134:20)>
                  *)(local_110 + 0x10));
      if ((pointer)local_110._0_8_ != (pointer)(local_110 + 0x10)) {
        operator_delete((void *)local_110._0_8_);
      }
      if ((pointer)local_178._0_8_ != ppVar6) {
        operator_delete((void *)local_178._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_98.first._M_dataplus._M_p);
      }
      if (local_150 != local_140) {
        operator_delete(local_150);
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 != local_e0);
  }
  this = local_e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_e8);
  if (local_130.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_130.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar6 = (pointer)(local_178 + 0x10);
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this,&(local_130.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first);
      ppVar12 = local_130.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppVar11 = local_130.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0x28 < (long)local_130.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_130.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) {
        local_178._0_8_ =
             local_130.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].first._M_dataplus._M_p;
        paVar2 = &local_130.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].first.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._0_8_ == paVar2) {
          local_178._16_8_ = paVar2->_M_allocated_capacity;
          uStack_160 = *(undefined8 *)
                        ((long)&local_130.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].first.field_2 + 8);
          local_178._0_8_ = ppVar6;
        }
        else {
          local_178._16_8_ = paVar2->_M_allocated_capacity;
        }
        ppVar3 = local_130.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_178._8_8_ =
             local_130.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].first._M_string_length;
        local_130.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].first._M_dataplus._M_p = (pointer)paVar2;
        local_130.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].first._M_string_length = 0;
        local_130.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].first.field_2._M_local_buf[0] = '\0';
        local_158 = local_130.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].second;
        std::__cxx11::string::operator=
                  ((string *)ppVar3,
                   (string *)
                   local_130.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        ppVar12[-1].second = ppVar11->second;
        if ((pointer)local_178._0_8_ == ppVar6) {
          local_110._24_8_ = uStack_160;
          local_110._0_8_ = (pointer)(local_110 + 0x10);
        }
        else {
          local_110._0_8_ = local_178._0_8_;
        }
        local_110._16_8_ = local_178._16_8_;
        local_110._8_8_ = local_178._8_8_;
        local_178._8_8_ = (pointer)0x0;
        local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
        local_f0 = local_158;
        local_178._0_8_ = ppVar6;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,int>*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>,long,std::pair<std::__cxx11::string,int>,__gnu_cxx::__ops::_Iter_comp_iter<set_priority(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&)::__0>>
                  (ppVar11,0,((long)ppVar3 - (long)ppVar11 >> 3) * -0x3333333333333333,local_110);
        this = local_e8;
        if ((pointer)local_110._0_8_ != (pointer)(local_110 + 0x10)) {
          operator_delete((void *)local_110._0_8_);
        }
        if ((pointer)local_178._0_8_ != ppVar6) {
          operator_delete((void *)local_178._0_8_);
        }
      }
      ppVar3 = local_130.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      pcVar7 = local_130.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].first._M_dataplus._M_p;
      ppVar9 = local_130.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      local_130.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar7 != &(ppVar9->first).field_2) {
        operator_delete(pcVar7);
      }
    } while (local_130.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_130.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&local_130);
  return;
}

Assistant:

void set_priority(vector<string>& v, const string& word){

    auto compare = [](pair<string, int> left, pair<string, int> right) {
        return right.second > left.second;
    };

    priority_queue<
            pair<string, int>,
            vector<pair<string, int>>,
            decltype(compare) >
    result(compare);

    for(string str : v) {
        int priority = 0;

        if(str == word)
            priority += 10;

        if(is_weak_anagram(str, word))
            priority += 5;

        if(str.length() == word.length())
            priority += 1;

        priority += 2*common_prefix_len(str, word);

        pair<string, int> compound = pair<string, int>(str, priority);
        result.push(compound);
    }

    v.clear();
    while(!result.empty()) {
        v.push_back(result.top().first);
        result.pop();
    }

}